

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O1

void __thiscall
Js::JavascriptPromiseReactionTaskFunction::ExtractSnapObjectDataInto
          (JavascriptPromiseReactionTaskFunction *this,SnapObject *objData,SlabAllocator *alloc)

{
  Var v;
  _func_int *p_Var1;
  uint dependsOnArrayCount;
  bool bVar2;
  unsigned_long *dependsOnArray;
  Type *pTVar3;
  uint32 i;
  ulong uVar4;
  ulong count;
  undefined1 local_68 [8];
  List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> depOnList
  ;
  
  depOnList._40_8_ = TTD::SlabAllocatorBase<0>::SlabAllocateTypeRawSize<56ul>(alloc);
  depOnList.super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>.
  _vptr_ReadOnlyList = (_func_int **)0x0;
  depOnList.super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>.buffer._0_4_ =
       0;
  depOnList.super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>._16_8_ =
       &Memory::HeapAllocator::Instance;
  local_68 = (undefined1  [8])&PTR_IsReadOnly_015454f0;
  depOnList.super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>.alloc =
       (Type)0x400000000;
  *(void **)depOnList._40_8_ = (this->argument).ptr;
  v = (this->argument).ptr;
  if (v != (Var)0x0) {
    bVar2 = TTD::JsSupport::IsVarComplexKind(v);
    if (bVar2) {
      p_Var1 = (_func_int *)(this->argument).ptr;
      JsUtil::
      List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
      EnsureArray((List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                   *)local_68,0);
      depOnList.super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>.
      _vptr_ReadOnlyList
      [(int)(uint)depOnList.
                  super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>.buffer]
           = p_Var1;
      depOnList.super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>.buffer.
      _0_4_ = (uint)depOnList.
                    super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>.buffer
              + 1;
    }
  }
  JavascriptPromiseReaction::ExtractSnapPromiseReactionInto
            ((this->reaction).ptr,(SnapPromiseReactionInfo *)(depOnList._40_8_ + 8),
             (List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              *)local_68,alloc);
  dependsOnArrayCount =
       (uint)depOnList.super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>.
             buffer;
  count = (ulong)(uint)depOnList.
                       super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>.
                       buffer;
  if (count == 0) {
    if (objData->SnapObjectTag != SnapPromiseReactionTaskFunctionObject) {
      TTDAbort_unrecoverable_error("Tag does not match.");
    }
    objData->AddtlSnapObjectInfo = (void *)depOnList._40_8_;
  }
  else {
    dependsOnArray = TTD::SlabAllocatorBase<0>::SlabAllocateArray<unsigned_long>(alloc,count);
    uVar4 = 0;
    do {
      pTVar3 = JsUtil::
               List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               ::Item((List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                       *)local_68,(int)uVar4);
      dependsOnArray[uVar4] = *pTVar3;
      uVar4 = uVar4 + 1;
    } while (count != uVar4);
    TTD::NSSnapObjects::
    StdExtractSetKindSpecificInfo<TTD::NSSnapObjects::SnapPromiseReactionTaskFunctionInfo*,(TTD::NSSnapObjects::SnapObjectType)30>
              (objData,(SnapPromiseReactionTaskFunctionInfo *)depOnList._40_8_,alloc,
               dependsOnArrayCount,dependsOnArray);
  }
  local_68 = (undefined1  [8])&PTR_IsReadOnly_015454f0;
  if (depOnList.super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>.
      _vptr_ReadOnlyList != (_func_int **)0x0) {
    Memory::HeapAllocator::Free
              ((HeapAllocator *)
               depOnList.super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>.
               _16_8_,depOnList.
                      super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>.
                      _vptr_ReadOnlyList,
               (long)(int)depOnList.
                          super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>.
                          alloc << 3);
  }
  return;
}

Assistant:

void JavascriptPromiseReactionTaskFunction::ExtractSnapObjectDataInto(TTD::NSSnapObjects::SnapObject* objData, TTD::SlabAllocator& alloc)
    {
        TTD::NSSnapObjects::SnapPromiseReactionTaskFunctionInfo* sprtfi = alloc.SlabAllocateStruct<TTD::NSSnapObjects::SnapPromiseReactionTaskFunctionInfo>();

        JsUtil::List<TTD_PTR_ID, HeapAllocator> depOnList(&HeapAllocator::Instance);

        sprtfi->Argument = this->argument;

        if(this->argument != nullptr && TTD::JsSupport::IsVarComplexKind(this->argument))
        {
            depOnList.Add(TTD_CONVERT_VAR_TO_PTR_ID(this->argument));
        }

        this->reaction->ExtractSnapPromiseReactionInto(&sprtfi->Reaction, depOnList, alloc);

        //see what we need to do wrt dependencies
        if(depOnList.Count() == 0)
        {
            TTD::NSSnapObjects::StdExtractSetKindSpecificInfo<TTD::NSSnapObjects::SnapPromiseReactionTaskFunctionInfo*, TTD::NSSnapObjects::SnapObjectType::SnapPromiseReactionTaskFunctionObject>(objData, sprtfi);
        }
        else
        {
            uint32 depOnCount = depOnList.Count();
            TTD_PTR_ID* depOnArray = alloc.SlabAllocateArray<TTD_PTR_ID>(depOnCount);

            for(uint32 i = 0; i < depOnCount; ++i)
            {
                depOnArray[i] = depOnList.Item(i);
            }

            TTD::NSSnapObjects::StdExtractSetKindSpecificInfo<TTD::NSSnapObjects::SnapPromiseReactionTaskFunctionInfo*, TTD::NSSnapObjects::SnapObjectType::SnapPromiseReactionTaskFunctionObject>(objData, sprtfi, alloc, depOnCount, depOnArray);
        }
    }